

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ClosePopupToLevel(int remaining)

{
  ImVector<ImGuiPopupRef> *this;
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  int i;
  ImGuiWindow *window;
  
  pIVar1 = GImGui;
  if (-1 < remaining) {
    this = &GImGui->OpenPopupStack;
    i = remaining + -1;
    if (remaining == 0) {
      i = 0;
    }
    pvVar2 = ImVector<ImGuiPopupRef>::operator[](this,i);
    window = (&pvVar2->Window)[remaining == 0];
    if ((pIVar1->NavLayer == 0) && (window->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      window = window->NavLastChildNavWindow;
    }
    ImGui::FocusWindow(window);
    (window->DC).NavHideHighlightOneFrame = true;
    ImVector<ImGuiPopupRef>::resize(this,remaining);
    return;
  }
  __assert_fail("remaining >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1391,"void ClosePopupToLevel(int)");
}

Assistant:

static void ClosePopupToLevel(int remaining)
{
    IM_ASSERT(remaining >= 0);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* focus_window = (remaining > 0) ? g.OpenPopupStack[remaining-1].Window : g.OpenPopupStack[0].ParentWindow;
    if (g.NavLayer == 0)
        focus_window = NavRestoreLastChildNavWindow(focus_window);
    ImGui::FocusWindow(focus_window);
    focus_window->DC.NavHideHighlightOneFrame = true;
    g.OpenPopupStack.resize(remaining);
}